

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O3

void Sbd_ManUpdateOrder(Sbd_Man_t *p,int Pivot)

{
  int iVar1;
  Vec_Int_t *p_00;
  undefined1 auVar2 [16];
  int iVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  Vec_Wec_t *pVVar6;
  int *piVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  size_t __size;
  ulong uVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  long lVar15;
  
  auVar2 = _DAT_0093d220;
  if ((Pivot < 0) || (p->vLutLevs->nSize <= Pivot)) {
LAB_0053a6e6:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar1 = p->vLutLevs->pArray[(uint)Pivot];
  pVVar6 = p->vDivLevels;
  iVar10 = pVVar6->nSize;
  if (0 < (long)iVar10) {
    pVVar5 = pVVar6->pArray;
    lVar8 = (long)iVar10 + -1;
    auVar12._8_4_ = (int)lVar8;
    auVar12._0_8_ = lVar8;
    auVar12._12_4_ = (int)((ulong)lVar8 >> 0x20);
    lVar8 = 0;
    auVar12 = auVar12 ^ _DAT_0093d220;
    auVar14 = _DAT_0093e4e0;
    auVar16 = _DAT_0093d210;
    do {
      auVar17 = auVar16 ^ auVar2;
      iVar13 = auVar12._4_4_;
      if ((bool)(~(auVar17._4_4_ == iVar13 && auVar12._0_4_ < auVar17._0_4_ ||
                  iVar13 < auVar17._4_4_) & 1)) {
        *(undefined4 *)((long)&pVVar5->nSize + lVar8) = 0;
      }
      if ((auVar17._12_4_ != auVar12._12_4_ || auVar17._8_4_ <= auVar12._8_4_) &&
          auVar17._12_4_ <= auVar12._12_4_) {
        *(undefined4 *)((long)&pVVar5[1].nSize + lVar8) = 0;
      }
      auVar17 = auVar14 ^ auVar2;
      iVar18 = auVar17._4_4_;
      if (iVar18 <= iVar13 && (iVar18 != iVar13 || auVar17._0_4_ <= auVar12._0_4_)) {
        *(undefined4 *)((long)&pVVar5[2].nSize + lVar8) = 0;
        *(undefined4 *)((long)&pVVar5[3].nSize + lVar8) = 0;
      }
      lVar15 = auVar16._8_8_;
      auVar16._0_8_ = auVar16._0_8_ + 4;
      auVar16._8_8_ = lVar15 + 4;
      lVar15 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 4;
      auVar14._8_8_ = lVar15 + 4;
      lVar8 = lVar8 + 0x40;
    } while ((ulong)(iVar10 + 3U >> 2) << 6 != lVar8);
  }
  pVVar6->nSize = 0;
  iVar10 = pVVar6->nCap;
  iVar13 = (int)((long)iVar1 + 1);
  if (iVar10 <= iVar1) {
    __size = ((long)iVar1 + 1) * 0x10;
    if (pVVar6->pArray == (Vec_Int_t *)0x0) {
      pVVar5 = (Vec_Int_t *)malloc(__size);
    }
    else {
      pVVar5 = (Vec_Int_t *)realloc(pVVar6->pArray,__size);
      iVar10 = pVVar6->nCap;
    }
    pVVar6->pArray = pVVar5;
    memset(pVVar5 + iVar10,0,(long)(iVar13 - iVar10) << 4);
    pVVar6->nCap = iVar13;
  }
  pVVar6->nSize = iVar13;
  pVVar5 = p->vWinObjs;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      iVar10 = pVVar5->pArray[lVar8];
      if (((long)iVar10 < 0) || (p->vLutLevs->nSize <= iVar10)) goto LAB_0053a6e6;
      pVVar6 = p->vDivLevels;
      uVar9 = p->vLutLevs->pArray[iVar10];
      iVar13 = pVVar6->nSize;
      if (iVar13 <= (int)uVar9) {
        iVar3 = uVar9 + 1;
        iVar18 = iVar13 * 2;
        if (iVar13 * 2 <= iVar3) {
          iVar18 = iVar3;
        }
        iVar13 = pVVar6->nCap;
        if (iVar13 < iVar18) {
          if (pVVar6->pArray == (Vec_Int_t *)0x0) {
            pVVar5 = (Vec_Int_t *)malloc((long)iVar18 << 4);
          }
          else {
            pVVar5 = (Vec_Int_t *)realloc(pVVar6->pArray,(long)iVar18 << 4);
            iVar13 = pVVar6->nCap;
          }
          pVVar6->pArray = pVVar5;
          memset(pVVar5 + iVar13,0,(long)(iVar18 - iVar13) << 4);
          pVVar6->nCap = iVar18;
        }
        pVVar6->nSize = iVar3;
        iVar13 = iVar3;
      }
      if (((int)uVar9 < 0) || (iVar13 <= (int)uVar9)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      Vec_IntPush(pVVar6->pArray + uVar9,iVar10);
      lVar8 = lVar8 + 1;
      pVVar5 = p->vWinObjs;
    } while (lVar8 < pVVar5->nSize);
  }
  pVVar5->nSize = 0;
  pVVar6 = p->vDivLevels;
  if (pVVar6->nSize < 1) {
LAB_0053a724:
    __assert_fail("nTimeValidDivs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                  ,0x16d,"void Sbd_ManUpdateOrder(Sbd_Man_t *, int)");
  }
  uVar11 = 0;
  uVar9 = 0;
  do {
    pVVar5 = pVVar6->pArray;
    qsort(pVVar5[uVar11].pArray,(long)pVVar5[uVar11].nSize,4,Vec_IntSortCompare1);
    if (0 < pVVar5[uVar11].nSize) {
      lVar8 = 0;
      do {
        iVar10 = pVVar5[uVar11].pArray[lVar8];
        if (((long)iVar10 < 0) || (p->vObj2Var->nSize <= iVar10)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        p_00 = p->vWinObjs;
        p->vObj2Var->pArray[iVar10] = p_00->nSize;
        Vec_IntPush(p_00,iVar10);
        lVar8 = lVar8 + 1;
      } while (lVar8 < pVVar5[uVar11].nSize);
    }
    if (uVar11 == iVar1 - 2) {
      uVar9 = p->vWinObjs->nSize;
    }
    uVar11 = uVar11 + 1;
    pVVar6 = p->vDivLevels;
  } while ((long)uVar11 < (long)pVVar6->nSize);
  if ((int)uVar9 < 1) goto LAB_0053a724;
  p->vDivVars->nSize = 0;
  p->DivCutoff = -1;
  uVar4 = 0x3f;
  if (0x3f < uVar9) {
    uVar4 = uVar9;
  }
  if (uVar4 - 0x3f < uVar9) {
    uVar11 = (ulong)(uVar4 - 0x3f);
    iVar10 = (uVar9 - uVar4) + 0x3f;
    do {
      if ((long)p->vWinObjs->nSize <= (long)uVar11) goto LAB_0053a6e6;
      if (p->DivCutoff == -1) {
        uVar9 = p->vWinObjs->pArray[uVar11];
        if (((int)uVar9 < 0) || (p->vLutLevs->nSize <= (int)uVar9)) goto LAB_0053a6e6;
        pVVar5 = p->vDivVars;
        if (p->vLutLevs->pArray[uVar9] == iVar1 + -2) {
          p->DivCutoff = pVVar5->nSize;
        }
      }
      else {
        pVVar5 = p->vDivVars;
      }
      Vec_IntPush(pVVar5,(int)uVar11);
      uVar11 = uVar11 + 1;
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
    if (p->DivCutoff != -1) goto LAB_0053a656;
  }
  p->DivCutoff = 0;
LAB_0053a656:
  pVVar5 = p->vDivValues;
  uVar9 = p->vDivVars->nSize;
  if (pVVar5->nCap < (int)uVar9) {
    if (pVVar5->pArray == (int *)0x0) {
      piVar7 = (int *)malloc((long)(int)uVar9 << 2);
    }
    else {
      piVar7 = (int *)realloc(pVVar5->pArray,(long)(int)uVar9 << 2);
    }
    pVVar5->pArray = piVar7;
    if (piVar7 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar5->nCap = uVar9;
  }
  if (0 < (int)uVar9) {
    memset(pVVar5->pArray,0,(ulong)uVar9 * 4);
  }
  pVVar5->nSize = uVar9;
  return;
}

Assistant:

void Sbd_ManUpdateOrder( Sbd_Man_t * p, int Pivot )
{
    int i, k, Node;
    Vec_Int_t * vLevel;
    int nTimeValidDivs = 0;
    // collect divisors by logic level
    int LevelMax = Vec_IntEntry(p->vLutLevs, Pivot);
    Vec_WecClear( p->vDivLevels );
    Vec_WecInit( p->vDivLevels, LevelMax + 1 );
    Vec_IntForEachEntry( p->vWinObjs, Node, i )
        Vec_WecPush( p->vDivLevels, Vec_IntEntry(p->vLutLevs, Node), Node );
    // reload divisors
    Vec_IntClear( p->vWinObjs );
    Vec_WecForEachLevel( p->vDivLevels, vLevel, i )
    {
        Vec_IntSort( vLevel, 0 );
        Vec_IntForEachEntry( vLevel, Node, k )
        {
            Vec_IntWriteEntry( p->vObj2Var, Node, Vec_IntSize(p->vWinObjs) );
            Vec_IntPush( p->vWinObjs, Node );
        }
        // remember divisor cutoff
        if ( i == LevelMax - 2 )
            nTimeValidDivs = Vec_IntSize(p->vWinObjs);
    }
    assert( nTimeValidDivs > 0 );
    Vec_IntClear( p->vDivVars );
    p->DivCutoff = -1;
    Vec_IntForEachEntryStartStop( p->vWinObjs, Node, i, Abc_MaxInt(0, nTimeValidDivs-63), nTimeValidDivs )
    {
        if ( p->DivCutoff == -1 && Vec_IntEntry(p->vLutLevs, Node) == LevelMax - 2 )
            p->DivCutoff = Vec_IntSize(p->vDivVars);
        Vec_IntPush( p->vDivVars, i );
    }
    if ( p->DivCutoff == -1 )
        p->DivCutoff = 0;
    // verify
/*
    assert( Vec_IntSize(p->vDivVars) < 64 );
    Vec_IntForEachEntryStart( p->vDivVars, Node, i, p->DivCutoff )
        assert( Vec_IntEntry(p->vLutLevs, Vec_IntEntry(p->vWinObjs, Node)) == LevelMax - 2 );
    Vec_IntForEachEntryStop( p->vDivVars, Node, i, p->DivCutoff )
        assert( Vec_IntEntry(p->vLutLevs, Vec_IntEntry(p->vWinObjs, Node)) < LevelMax - 2 );
*/
    Vec_IntFill( p->vDivValues, Vec_IntSize(p->vDivVars), 0 );
    //printf( "%d ", Vec_IntSize(p->vDivVars) );
//    printf( "Node %4d :  Win = %5d.   Divs = %5d.    D1 = %5d.  D2 = %5d.\n",  
//        Pivot, Vec_IntSize(p->vWinObjs), Vec_IntSize(p->vDivVars), Vec_IntSize(p->vDivVars)-p->DivCutoff, p->DivCutoff );
}